

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O3

int secp256k1_borromean_sign
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,uchar *e0,secp256k1_scalar *s,
              secp256k1_gej *pubs,secp256k1_scalar *k,secp256k1_scalar *sec,size_t *rsizes,
              size_t *secidx,size_t nrings,uchar *m,size_t mlen)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  secp256k1_gej *psVar5;
  ulong uVar6;
  uchar *data;
  secp256k1_scalar *psVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  size_t size;
  secp256k1_scalar ens;
  uchar tmp [33];
  secp256k1_gej rgej;
  secp256k1_ge rge;
  uint local_2ac;
  int local_2a8;
  uint local_2a4;
  long local_2a0;
  size_t local_298;
  long local_290;
  ulong local_288;
  size_t local_280;
  uchar *local_278;
  secp256k1_scalar *local_270;
  secp256k1_scalar local_268;
  secp256k1_scalar *local_248;
  secp256k1_scalar *local_240;
  secp256k1_gej *local_238;
  secp256k1_gej *local_230;
  secp256k1_scalar *local_228;
  secp256k1_ecmult_gen_context *local_220;
  secp256k1_sha256 local_218;
  uchar local_1a8 [48];
  secp256k1_sha256 local_178;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  local_178.s[0] = 0x6a09e667;
  local_178.s[1] = 0xbb67ae85;
  local_178.s[2] = 0x3c6ef372;
  local_178.s[3] = 0xa54ff53a;
  local_178.s[4] = 0x510e527f;
  local_178.s[5] = 0x9b05688c;
  local_178.s[6] = 0x1f83d9ab;
  local_178.s[7] = 0x5be0cd19;
  local_178.bytes = 0;
  local_270 = k;
  local_220 = ecmult_gen_ctx;
  if (nrings == 0) {
    secp256k1_sha256_write(&local_178,m,mlen);
    secp256k1_sha256_finalize(&local_178,e0);
  }
  else {
    local_228 = s + 1;
    local_230 = pubs + 1;
    local_290 = 0;
    sVar8 = 0;
    local_278 = e0;
    local_248 = sec;
    local_240 = s;
    local_238 = pubs;
    do {
      secp256k1_ecmult_gen(local_220,&local_108,local_270 + sVar8);
      secp256k1_ge_set_gej(&local_88,&local_108);
      if (local_108.infinity != 0) {
        return 0;
      }
      secp256k1_eckey_pubkey_serialize(&local_88,local_1a8,&local_280,1);
      uVar6 = secidx[sVar8] + 1;
      local_298 = sVar8;
      if (uVar6 < rsizes[sVar8]) {
        uVar2 = (uint)sVar8;
        local_2a0 = CONCAT44(local_2a0._4_4_,
                             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
        lVar4 = secidx[sVar8] + local_290;
        psVar7 = local_228 + lVar4;
        psVar5 = local_230 + lVar4;
        do {
          local_218.s[0] = 0x6a09e667;
          local_218.s[1] = 0xbb67ae85;
          local_218.s[2] = 0x3c6ef372;
          local_218.s[3] = 0xa54ff53a;
          local_218.s[4] = 0x510e527f;
          local_218.s[5] = 0x9b05688c;
          local_218.s[6] = 0x1f83d9ab;
          local_218.s[7] = 0x5be0cd19;
          local_218.bytes = 0;
          local_2ac = (uint)local_2a0;
          uVar2 = (uint)uVar6;
          local_2a4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18;
          secp256k1_sha256_write(&local_218,local_1a8,0x21);
          secp256k1_sha256_write(&local_218,m,mlen);
          secp256k1_sha256_write(&local_218,(uchar *)&local_2ac,4);
          secp256k1_sha256_write(&local_218,(uchar *)&local_2a4,4);
          secp256k1_sha256_finalize(&local_218,local_1a8);
          secp256k1_scalar_set_b32(&local_268,local_1a8,&local_2a8);
          if (local_2a8 != 0) {
            return 0;
          }
          if ((local_268.d[3] == 0 && local_268.d[1] == 0) &&
              (local_268.d[2] == 0 && local_268.d[0] == 0)) {
            return 0;
          }
          secp256k1_ecmult(&local_108,psVar5,&local_268,psVar7);
          if (local_108.infinity != 0) {
            return 0;
          }
          local_288 = uVar6;
          secp256k1_ge_set_gej_var(&local_88,&local_108);
          uVar6 = local_288;
          secp256k1_eckey_pubkey_serialize(&local_88,local_1a8,&local_280,1);
          uVar6 = uVar6 + 1;
          psVar7 = psVar7 + 1;
          psVar5 = psVar5 + 1;
        } while (uVar6 < rsizes[local_298]);
      }
      secp256k1_sha256_write(&local_178,local_1a8,local_280);
      local_290 = local_290 + rsizes[local_298];
      sVar8 = local_298 + 1;
    } while (sVar8 != nrings);
    secp256k1_sha256_write(&local_178,m,mlen);
    data = local_278;
    secp256k1_sha256_finalize(&local_178,local_278);
    local_2a0 = 0;
    local_288 = 0;
    do {
      local_218.s[0] = 0x6a09e667;
      local_218.s[1] = 0xbb67ae85;
      local_218.s[2] = 0x3c6ef372;
      local_218.s[3] = 0xa54ff53a;
      local_218.s[4] = 0x510e527f;
      local_218.s[5] = 0x9b05688c;
      local_218.s[6] = 0x1f83d9ab;
      local_218.s[7] = 0x5be0cd19;
      local_218.bytes = 0;
      uVar2 = (uint)local_288;
      local_2ac = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      local_298 = CONCAT44(local_298._4_4_,local_2ac);
      local_2a4 = 0;
      secp256k1_sha256_write(&local_218,data,0x20);
      secp256k1_sha256_write(&local_218,m,mlen);
      secp256k1_sha256_write(&local_218,(uchar *)&local_2ac,4);
      secp256k1_sha256_write(&local_218,(uchar *)&local_2a4,4);
      secp256k1_sha256_finalize(&local_218,local_1a8);
      secp256k1_scalar_set_b32(&local_268,local_1a8,&local_2a8);
      if ((local_2a8 != 0) ||
         ((local_268.d[3] == 0 && local_268.d[1] == 0) &&
          (local_268.d[2] == 0 && local_268.d[0] == 0))) {
        return 0;
      }
      psVar7 = local_240 + local_2a0;
      psVar5 = local_238 + local_2a0;
      uVar6 = 0;
      while (uVar1 = local_288, uVar6 < secidx[local_288]) {
        secp256k1_ecmult(&local_108,psVar5,&local_268,psVar7);
        if (local_108.infinity != 0) {
          return 0;
        }
        secp256k1_ge_set_gej_var(&local_88,&local_108);
        secp256k1_eckey_pubkey_serialize(&local_88,local_1a8,&local_280,1);
        uVar6 = uVar6 + 1;
        local_218.s[0] = 0x6a09e667;
        local_218.s[1] = 0xbb67ae85;
        local_218.s[2] = 0x3c6ef372;
        local_218.s[3] = 0xa54ff53a;
        local_218.s[4] = 0x510e527f;
        local_218.s[5] = 0x9b05688c;
        local_218.s[6] = 0x1f83d9ab;
        local_218.s[7] = 0x5be0cd19;
        local_218.bytes = 0;
        local_2ac = (uint)local_298;
        uVar2 = (uint)uVar6;
        local_2a4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        secp256k1_sha256_write(&local_218,local_1a8,0x21);
        secp256k1_sha256_write(&local_218,m,mlen);
        secp256k1_sha256_write(&local_218,(uchar *)&local_2ac,4);
        secp256k1_sha256_write(&local_218,(uchar *)&local_2a4,4);
        secp256k1_sha256_finalize(&local_218,local_1a8);
        secp256k1_scalar_set_b32(&local_268,local_1a8,&local_2a8);
        if (local_2a8 != 0) {
          return 0;
        }
        psVar7 = psVar7 + 1;
        psVar5 = psVar5 + 1;
        if ((local_268.d[3] == 0 && local_268.d[1] == 0) &&
            (local_268.d[2] == 0 && local_268.d[0] == 0)) {
          return 0;
        }
      }
      secp256k1_scalar_mul(psVar7,&local_268,local_248 + local_288);
      secp256k1_scalar_negate(psVar7,psVar7);
      iVar3 = secp256k1_scalar_add(psVar7,psVar7,local_270 + uVar1);
      auVar9._0_4_ = -(uint)((int)psVar7->d[2] == 0 && (int)psVar7->d[0] == 0);
      auVar9._4_4_ = -(uint)(*(int *)((long)psVar7->d + 0x14) == 0 &&
                            *(int *)((long)psVar7->d + 4) == 0);
      auVar9._8_4_ = -(uint)((int)psVar7->d[3] == 0 && (int)psVar7->d[1] == 0);
      auVar9._12_4_ =
           -(uint)(*(int *)((long)psVar7->d + 0x1c) == 0 && *(int *)((long)psVar7->d + 0xc) == 0);
      iVar3 = movmskps(iVar3,auVar9);
      if (iVar3 == 0xf) {
        return 0;
      }
      local_2a0 = local_2a0 + rsizes[uVar1];
      local_288 = uVar1 + 1;
      data = local_278;
    } while (local_288 != nrings);
  }
  return 1;
}

Assistant:

int secp256k1_borromean_sign(const secp256k1_ecmult_gen_context *ecmult_gen_ctx,
 unsigned char *e0, secp256k1_scalar *s, const secp256k1_gej *pubs, const secp256k1_scalar *k, const secp256k1_scalar *sec,
 const size_t *rsizes, const size_t *secidx, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_gen_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(k != NULL);
    VERIFY_CHECK(sec != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(secidx != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    secp256k1_sha256_initialize(&sha256_e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_ecmult_gen(ecmult_gen_ctx, &rgej, &k[i]);
        secp256k1_ge_set_gej(&rge, &rgej);
        if (secp256k1_gej_is_infinity(&rgej)) {
            return 0;
        }
        secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        for (j = secidx[i] + 1; j < rsizes[i]; j++) {
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
            /** The signing algorithm as a whole is not memory uniform so there is likely a cache sidechannel that
             *  leaks which members are non-forgeries. That the forgeries themselves are variable time may leave
             *  an additional privacy impacting timing side-channel, but not a key loss one.
             */
            secp256k1_ecmult(&rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        }
        secp256k1_sha256_write(&sha256_e0, tmp, size);
        count += rsizes[i];
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ens)) {
            return 0;
        }
        for (j = 0; j < secidx[i]; j++) {
            secp256k1_ecmult(&rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
        }
        secp256k1_scalar_mul(&s[count + j], &ens, &sec[i]);
        secp256k1_scalar_negate(&s[count + j], &s[count + j]);
        secp256k1_scalar_add(&s[count + j], &s[count + j], &k[i]);
        if (secp256k1_scalar_is_zero(&s[count + j])) {
            return 0;
        }
        count += rsizes[i];
    }
    secp256k1_scalar_clear(&ens);
    secp256k1_ge_clear(&rge);
    secp256k1_gej_clear(&rgej);
    memset(tmp, 0, 33);
    return 1;
}